

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O3

void __thiscall klogic::mlmvn::learn(mlmvn *this,cvector *X,cvector *errs,double learning_rate)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  const_iterator Xbeg;
  size_t sVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  pointer pmVar8;
  long lVar9;
  ulong uVar10;
  
  calculate_errors(this,errs);
  mlmvn_forward_base::start
            (&this->calculator,X,
             (this->calculator).layer1.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  (this->calculator).use_out = false;
  do {
    uVar6 = (ulong)(this->calculator).layer;
    pvVar1 = (this->neurons).
             super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pmVar8 = *(pointer *)
              &pvVar1[uVar6].super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>._M_impl;
    if (*(pointer *)
         ((long)&pvVar1[uVar6].super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>._M_impl
         + 8) != pmVar8) {
      pvVar2 = (this->neurons).
               super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar3 = (this->errors).
               super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Xbeg._M_current =
           (((this->calculator).from)->
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
      sVar4 = (this->calculator).from_size;
      lVar7 = 0;
      lVar9 = 0;
      uVar10 = 0;
      do {
        mvn::learn((mvn *)((long)&(pmVar8->weights).
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          + lVar7),Xbeg,Xbeg._M_current + sVar4,
                   (cmplx *)(*(long *)&pvVar3[uVar6].
                                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                       ._M_impl.super__Vector_impl_data + lVar9),learning_rate,
                   uVar6 < ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555 - 1U);
        uVar10 = uVar10 + 1;
        pmVar8 = *(pointer *)
                  &pvVar1[uVar6].super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>.
                   _M_impl;
        lVar9 = lVar9 + 0x10;
        lVar7 = lVar7 + 0x20;
      } while (uVar10 < (ulong)((long)*(pointer *)
                                       ((long)&pvVar1[uVar6].
                                               super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>
                                               ._M_impl + 8) - (long)pmVar8 >> 5));
    }
    bVar5 = mlmvn_forward_base::step(&this->calculator);
  } while (!bVar5);
  return;
}

Assistant:

void klogic::mlmvn::learn(const klogic::cvector &X, const klogic::cvector &errs,
                          double learning_rate)
{
    // Calculate errors for all neurons (backward pass)
    calculate_errors(errs);

    // dump_errors();

    // Make a forward pass with error correction
    calculator.start(X);

    do {
        int layer = calculator.current_layer();

        // Divide by |z| for all layers except output
        bool variable_rate = layer < layers_count() - 1;

        vector<mvn>   &layer_neurons = neurons[layer];
        cvector const &layer_errors  = errors[layer];

        // Input for current layer
        cvector::const_iterator input_begin = calculator.input_begin(),
                                input_end   = calculator.input_end();

        // Learn current layer of neurons
//#pragma omp parallel
        {
//#pragma omp for
            for (int k = 0; k < layer_neurons.size(); ++k) {
                layer_neurons[k].learn(input_begin, input_end, layer_errors[k],
                                       learning_rate, variable_rate);
            }
        }
    } while (!calculator.step());

    // dump();
}